

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ocsp.cc
# Opt level: O0

int i2r_ocsp_acutoff(X509V3_EXT_METHOD *method,void *cutoff,BIO *bp,int ind)

{
  int iVar1;
  int ind_local;
  BIO *bp_local;
  void *cutoff_local;
  X509V3_EXT_METHOD *method_local;
  
  iVar1 = BIO_printf((BIO *)bp,"%*s",(ulong)(uint)ind,"");
  if (iVar1 < 1) {
    method_local._4_4_ = 0;
  }
  else {
    iVar1 = ASN1_GENERALIZEDTIME_print((BIO *)bp,(ASN1_GENERALIZEDTIME *)cutoff);
    if (iVar1 == 0) {
      method_local._4_4_ = 0;
    }
    else {
      method_local._4_4_ = 1;
    }
  }
  return method_local._4_4_;
}

Assistant:

static int i2r_ocsp_acutoff(const X509V3_EXT_METHOD *method, void *cutoff,
                            BIO *bp, int ind) {
  if (BIO_printf(bp, "%*s", ind, "") <= 0) {
    return 0;
  }
  if (!ASN1_GENERALIZEDTIME_print(
          bp, reinterpret_cast<ASN1_GENERALIZEDTIME *>(cutoff))) {
    return 0;
  }
  return 1;
}